

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_get_input_channel_map
                    (ma_data_converter *pConverter,ma_channel *pChannelMap,size_t channelMapCap)

{
  ma_channel *in_RDX;
  ma_channel_converter *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  ma_uint32 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (in_RSI == (ma_channel_converter *)0x0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    if (*(char *)(in_RDI + 0x12a) == '\0') {
      ma_channel_map_init_standard
                ((ma_standard_channel_map)((ulong)in_RDI >> 0x20),(ma_channel *)in_RSI,
                 (size_t)in_RDX,in_stack_ffffffffffffffdc);
    }
    else {
      ma_channel_converter_get_output_channel_map
                (in_RSI,in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_converter_get_input_channel_map(const ma_data_converter* pConverter, ma_channel* pChannelMap, size_t channelMapCap)
{
    if (pConverter == NULL || pChannelMap == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConverter->hasChannelConverter) {
        ma_channel_converter_get_output_channel_map(&pConverter->channelConverter, pChannelMap, channelMapCap);
    } else {
        ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pConverter->channelsOut);
    }

    return MA_SUCCESS;
}